

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumberObject.cpp
# Opt level: O1

void __thiscall
Js::JavascriptNumberObject::JavascriptNumberObject(JavascriptNumberObject *this,DynamicType *type)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01543150;
  Memory::Recycler::WBSetBit((char *)&this->value);
  (this->value).ptr = &DAT_1000000000000;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->value);
  if ((type->super_Type).typeId != TypeIds_NumberObject) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumberObject.cpp"
                                ,0xc,"(type->GetTypeId() == TypeIds_NumberObject)",
                                "type->GetTypeId() == TypeIds_NumberObject");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

JavascriptNumberObject::JavascriptNumberObject(DynamicType * type)
        : DynamicObject(type), value(Js::TaggedInt::ToVarUnchecked(0))
    {
        Assert(type->GetTypeId() == TypeIds_NumberObject);
    }